

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_expire(Curl_easy *data,time_t milli,expire_id id)

{
  Curl_multi *pCVar1;
  uint uVar2;
  timediff_t tVar3;
  Curl_tree *pCVar4;
  curltime cVar5;
  curltime newer;
  curltime i;
  int rc;
  timediff_t diff;
  undefined4 uStack_44;
  undefined1 local_40 [8];
  curltime set;
  curltime *nowp;
  Curl_multi *multi;
  expire_id id_local;
  time_t milli_local;
  Curl_easy *data_local;
  
  pCVar1 = data->multi;
  set._8_8_ = &(data->state).expiretime;
  if (pCVar1 != (Curl_multi *)0x0) {
    cVar5 = Curl_now();
    set.tv_sec._4_4_ = uStack_44;
    local_40 = (undefined1  [8])(milli / 1000 + cVar5.tv_sec);
    set.tv_sec._0_4_ = (int)(milli % 1000) * 1000 + cVar5.tv_usec;
    if (999999 < (int)set.tv_sec) {
      local_40 = (undefined1  [8])((long)local_40 + 1);
      set.tv_sec._0_4_ = (int)set.tv_sec + -1000000;
    }
    multi_deltimeout(data,id);
    multi_addtimeout(data,(curltime *)local_40,id);
    if ((*(long *)set._8_8_ != 0) || (*(int *)(set._8_8_ + 8) != 0)) {
      newer.tv_usec = (int)set.tv_sec;
      newer.tv_sec = (time_t)local_40;
      cVar5._12_4_ = 0;
      cVar5._0_12_ = *(undefined1 (*) [12])set._8_8_;
      newer._12_4_ = 0;
      tVar3 = Curl_timediff(newer,cVar5);
      if (0 < tVar3) {
        return;
      }
      uVar2 = Curl_splayremovebyaddr(pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
      if (uVar2 != 0) {
        Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)uVar2);
      }
    }
    *(undefined1 (*) [8])set._8_8_ = local_40;
    *(ulong *)(set._8_8_ + 8) = CONCAT44(set.tv_sec._4_4_,(int)set.tv_sec);
    (data->state).timenode.payload = data;
    i._12_4_ = 0;
    i._0_12_ = *(undefined1 (*) [12])set._8_8_;
    pCVar4 = Curl_splayinsert(i,pCVar1->timetree,&(data->state).timenode);
    pCVar1->timetree = pCVar4;
  }
  return;
}

Assistant:

void Curl_expire(struct Curl_easy *data, time_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *nowp = &data->state.expiretime;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = Curl_now();
  set.tv_sec += milli/1000;
  set.tv_usec += (unsigned int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list.  It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(nowp->tv_sec || nowp->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *nowp);
    int rc;

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We don't need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d\n", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *nowp = set;
  data->state.timenode.payload = data;
  multi->timetree = Curl_splayinsert(*nowp, multi->timetree,
                                     &data->state.timenode);
}